

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_int>_>::moveAppend
          (QGenericArrayOps<std::pair<QString,_int>_> *this,pair<QString,_int> *b,
          pair<QString,_int> *e)

{
  pair<QString,_int> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  pair<QString,_int> *in_RDI;
  pair<QString,_int> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<std::pair<QString,_int>_>::begin
                        ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bfa47);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      std::pair<QString,_int>::pair(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }